

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.h
# Opt level: O1

void __thiscall CECorrections::~CECorrections(CECorrections *this)

{
  pointer pcVar1;
  
  this->_vptr_CECorrections = (_func_int **)&PTR__CECorrections_00113be0;
  if (*(void **)&this->ttut1_delt_ != (void *)0x0) {
    operator_delete(*(void **)&this->ttut1_delt_);
  }
  if (*(void **)&this->ttut1_mjd_ != (void *)0x0) {
    operator_delete(*(void **)&this->ttut1_mjd_);
  }
  if (*(void **)&this->nutation_dpsi_ != (void *)0x0) {
    operator_delete(*(void **)&this->nutation_dpsi_);
  }
  if (*(void **)&this->nutation_deps_ != (void *)0x0) {
    operator_delete(*(void **)&this->nutation_deps_);
  }
  if (*(void **)&this->nutation_yp_ != (void *)0x0) {
    operator_delete(*(void **)&this->nutation_yp_);
  }
  if (*(void **)&this->nutation_xp_ != (void *)0x0) {
    operator_delete(*(void **)&this->nutation_xp_);
  }
  if (*(void **)&this->nutation_dut1_ != (void *)0x0) {
    operator_delete(*(void **)&this->nutation_dut1_);
  }
  if (*(void **)&this->nutation_mjd_ != (void *)0x0) {
    operator_delete(*(void **)&this->nutation_mjd_);
  }
  pcVar1 = (this->ttut1_file_pred_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->ttut1_file_pred_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->ttut1_file_hist_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->ttut1_file_hist_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->nutation_file_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->nutation_file_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~CECorrections() {}